

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O3

void oonf_layer2_neigh_relabel
               (oonf_layer2_neigh *l2neigh,oonf_layer2_origin *new_origin,
               oonf_layer2_origin *old_origin)

{
  long lVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  lVar1 = 0xd0;
  do {
    if (*(oonf_layer2_origin **)((l2neigh->key).addr._addr + lVar1) == old_origin) {
      *(oonf_layer2_origin **)((l2neigh->key).addr._addr + lVar1) = new_origin;
    }
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0x4e0);
  plVar3 = (l2neigh->remote_neighbor_ips).list_head.prev;
  for (plVar2 = (l2neigh->remote_neighbor_ips).list_head.next; plVar2->prev != plVar3;
      plVar2 = plVar2->next) {
    if ((oonf_layer2_origin *)plVar2[-4].next == old_origin) {
      plVar2[-4].next = (list_entity *)new_origin;
      plVar3 = (l2neigh->remote_neighbor_ips).list_head.prev;
    }
  }
  plVar3 = (l2neigh->destinations).list_head.prev;
  for (plVar2 = (l2neigh->destinations).list_head.next; plVar2->prev != plVar3;
      plVar2 = plVar2->next) {
    if ((oonf_layer2_origin *)plVar2[-1].prev == old_origin) {
      plVar2[-1].prev = (list_entity *)new_origin;
      plVar3 = (l2neigh->destinations).list_head.prev;
    }
  }
  return;
}

Assistant:

void
oonf_layer2_neigh_relabel(struct oonf_layer2_neigh *l2neigh, const struct oonf_layer2_origin *new_origin,
  const struct oonf_layer2_origin *old_origin) {
  struct oonf_layer2_neighbor_address *neigh_ip;
  struct oonf_layer2_destination *l2dst;
  size_t i;

  for (i = 0; i < OONF_LAYER2_NEIGH_COUNT; i++) {
    if (oonf_layer2_data_get_origin(&l2neigh->data[i]) == old_origin) {
      oonf_layer2_data_set_origin(&l2neigh->data[i], new_origin);
    }
  }

  avl_for_each_element(&l2neigh->remote_neighbor_ips, neigh_ip, _neigh_node) {
    if (neigh_ip->origin == old_origin) {
      neigh_ip->origin = new_origin;
    }
  }

  avl_for_each_element(&l2neigh->destinations, l2dst, _node) {
    if (l2dst->origin == old_origin) {
      l2dst->origin = new_origin;
    }
  }
}